

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O2

QRect QHighDpi::fromNativePixels<QRect,QWidgetWindow>(QRect *value,QWidgetWindow *context)

{
  QPoint origin;
  double extraout_XMM0_Qa;
  QRect QVar1;
  
  origin = (QPoint)QHighDpiScaling::scaleAndOrigin(&context->super_QWindow,(Point)ZEXT812(0));
  QVar1 = scale(value,1.0 / extraout_XMM0_Qa,origin);
  return QVar1;
}

Assistant:

T fromNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, qreal(1) / so.factor, so.origin);
}